

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.hpp
# Opt level: O2

void __thiscall true_node::exec(true_node *this,test_agent_proxy *ap,test_handler *hdl)

{
  _Manager_type p_Var1;
  _Any_data local_28;
  _Manager_type local_18;
  _Invoker_type local_10;
  
  ap->m_agent->m_true_counter = ap->m_agent->m_true_counter + 1;
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (_Manager_type)0x0;
  local_10 = hdl->_M_invoker;
  p_Var1 = (hdl->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_28._M_unused._0_8_ = (undefined8)*(undefined8 *)&(hdl->super__Function_base)._M_functor;
    local_28._8_8_ = *(undefined8 *)((long)&(hdl->super__Function_base)._M_functor + 8);
    (hdl->super__Function_base)._M_manager = (_Manager_type)0x0;
    hdl->_M_invoker = (_Invoker_type)0x0;
    local_18 = p_Var1;
  }
  ranger::bhvr_tree::
  agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
  ::operator()(ap,(handler_type *)&local_28,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void exec(test_agent_proxy& ap, test_handler hdl) const final {
    ap->increase_true_counter();
    behavior_node<true>::exec(ap, std::move(hdl));
  }